

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

optional<cmSwiftCompileMode> __thiscall
cmLocalGenerator::GetSwiftCompileMode
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  cmValue cVar2;
  cmValue cVar3;
  ulong uVar4;
  ulong uVar5;
  string expandedCompileMode;
  string local_70;
  string local_50;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expandedCompileMode,"CMAKE_Swift_COMPILATION_MODE_DEFAULT",
             (allocator<char> *)&local_70);
  cVar2 = cmMakefile::GetDefinition(this_00,&expandedCompileMode);
  std::__cxx11::string::~string((string *)&expandedCompileMode);
  if ((cVar2.Value == (string *)0x0) || ((cVar2.Value)->_M_string_length == 0)) {
    uVar5 = 0;
    uVar4 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expandedCompileMode,"Swift_COMPILATION_MODE",(allocator<char> *)&local_70)
    ;
    cVar3 = cmGeneratorTarget::GetProperty(target,&expandedCompileMode);
    std::__cxx11::string::~string((string *)&expandedCompileMode);
    if (cVar3.Value != (string *)0x0) {
      cVar2 = cVar3;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)cVar2.Value);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&expandedCompileMode,&local_50,this,config,target,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = std::operator==(&expandedCompileMode,"wholemodule");
    if (bVar1) {
      uVar5 = 0;
    }
    else {
      bVar1 = std::operator==(&expandedCompileMode,"singlefile");
      if (bVar1) {
        uVar5 = 2;
      }
      else {
        bVar1 = std::operator==(&expandedCompileMode,"incremental");
        uVar5 = (ulong)!bVar1 * 2 + 1;
      }
    }
    std::__cxx11::string::~string((string *)&expandedCompileMode);
    uVar4 = 0x100000000;
  }
  return (_Optional_base<cmSwiftCompileMode,_true,_true>)
         (_Optional_base<cmSwiftCompileMode,_true,_true>)(uVar5 | uVar4);
}

Assistant:

cm::optional<cmSwiftCompileMode> cmLocalGenerator::GetSwiftCompileMode(
  cmGeneratorTarget const* target, std::string const& config)
{
  cmMakefile const* mf = this->GetMakefile();
  cmValue const swiftCompileModeDefault =
    mf->GetDefinition("CMAKE_Swift_COMPILATION_MODE_DEFAULT");
  if (!cmNonempty(swiftCompileModeDefault)) {
    return {};
  }
  cmValue swiftCompileMode = target->GetProperty("Swift_COMPILATION_MODE");
  if (!swiftCompileMode) {
    swiftCompileMode = swiftCompileModeDefault;
  }

  std::string const expandedCompileMode =
    cmGeneratorExpression::Evaluate(*swiftCompileMode, this, config, target);
  if (expandedCompileMode == "wholemodule") {
    return cmSwiftCompileMode::Wholemodule;
  }
  if (expandedCompileMode == "singlefile") {
    return cmSwiftCompileMode::Singlefile;
  }
  if (expandedCompileMode == "incremental") {
    return cmSwiftCompileMode::Incremental;
  }
  return cmSwiftCompileMode::Unknown;
}